

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int stats_arenas_i_bins_j_nonfull_slabs_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ctl_arena_t *pcVar1;
  size_t *in_RCX;
  long in_RSI;
  ulong *in_R8;
  long in_R9;
  long in_stack_00000008;
  size_t copylen;
  size_t oldval;
  int ret;
  size_t in_stack_ffffffffffffffa0;
  malloc_mutex_t *in_stack_ffffffffffffffa8;
  tsdn_t *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar2;
  
  malloc_mutex_lock((tsdn_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (malloc_mutex_t *)in_stack_ffffffffffffffb0);
  if ((in_R9 == 0) && (in_stack_00000008 == 0)) {
    pcVar1 = arenas_i(in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffb0 =
         (tsdn_t *)pcVar1->astats->bstats[*(long *)(in_RSI + 0x20)].nonfull_slabs;
    if ((in_RCX != (size_t *)0x0) && (in_R8 != (ulong *)0x0)) {
      if (*in_R8 != 8) {
        if (*in_R8 < 8) {
          in_stack_ffffffffffffffa8 = (malloc_mutex_t *)*in_R8;
        }
        else {
          in_stack_ffffffffffffffa8 = (malloc_mutex_t *)0x8;
        }
        memcpy(in_RCX,&stack0xffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
        iVar2 = 0x16;
        goto LAB_00155e94;
      }
      *in_RCX = (size_t)in_stack_ffffffffffffffb0;
    }
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
  }
LAB_00155e94:
  malloc_mutex_unlock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return iVar2;
}

Assistant:

static const ctl_named_node_t *
stats_arenas_i_bins_j_index(tsdn_t *tsdn, const size_t *mib,
    size_t miblen, size_t j) {
	if (j > SC_NBINS) {
		return NULL;
	}
	return super_stats_arenas_i_bins_j_node;
}